

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void ValidateOptions(void)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (g_options.input_file._M_string_length == 0) {
    pcVar2 = "error: no input file\n";
  }
  else {
    if (g_options.stdlib_path._M_string_length != 0) {
      return;
    }
    pcVar2 = "error: no stdlib path, which is required for now.\n";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,usage);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void ValidateOptions() {
  if (g_options.input_file.empty()) {
    std::cout << "error: no input file\n" << std::endl;
    std::cout << usage << std::endl;
    std::exit(1);
  }

  if (g_options.stdlib_path.empty()) {
    std::cout << "error: no stdlib path, which is required for now.\n"
              << std::endl;
    std::cout << usage << std::endl;
    std::exit(1);
  }
}